

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_main.c
# Opt level: O0

int cpu_request_core_type(cpu_purpose_t purpose,cpu_raw_data_array_t *raw_array,cpu_id_t *data)

{
  int iVar1;
  cpu_purpose_t cVar2;
  undefined1 local_60 [8];
  internal_id_info_t throwaway;
  cpu_raw_data_array_t my_raw_array;
  logical_cpu_t logical_cpu;
  int r;
  cpu_id_t *data_local;
  cpu_raw_data_array_t *raw_array_local;
  cpu_purpose_t purpose_local;
  
  data_local = (cpu_id_t *)raw_array;
  if (raw_array == (cpu_raw_data_array_t *)0x0) {
    iVar1 = cpuid_get_all_raw_data((cpu_raw_data_array_t *)(throwaway.cache_mask + 3));
    if (iVar1 < 0) {
      return iVar1;
    }
    data_local = (cpu_id_t *)(throwaway.cache_mask + 3);
  }
  my_raw_array.raw._2_2_ = ARCHITECTURE_X86 >> 0x10;
  while( true ) {
    if ((ushort)*(undefined2 *)((long)&data_local->architecture + 2) <=
        (ushort)my_raw_array.raw._2_2_) {
      iVar1 = cpuid_set_error(ERR_NOT_FOUND);
      return iVar1;
    }
    cVar2 = cpu_ident_purpose((cpu_raw_data_t *)
                              (*(long *)data_local->vendor_str +
                              (ulong)(ushort)my_raw_array.raw._2_2_ * 0x6b0));
    if (cVar2 == purpose) break;
    my_raw_array.raw._2_2_ = my_raw_array.raw._2_2_ + 1;
  }
  cpu_ident_internal((cpu_raw_data_t *)
                     (*(long *)data_local->vendor_str +
                     (ulong)(ushort)my_raw_array.raw._2_2_ * 0x6b0),data,
                     (internal_id_info_t *)local_60);
  iVar1 = cpuid_set_error(ERR_OK);
  return iVar1;
}

Assistant:

int cpu_request_core_type(cpu_purpose_t purpose, struct cpu_raw_data_array_t* raw_array, struct cpu_id_t* data)
{
	int r;
	logical_cpu_t logical_cpu = 0;
	struct cpu_raw_data_array_t my_raw_array;
	struct internal_id_info_t throwaway;

	if (!raw_array) {
		if ((r = cpuid_get_all_raw_data(&my_raw_array)) < 0)
			return r;
		raw_array = &my_raw_array;
	}

	for (logical_cpu = 0; logical_cpu < raw_array->num_raw; logical_cpu++) {
		if (cpu_ident_purpose(&raw_array->raw[logical_cpu]) == purpose) {
			cpu_ident_internal(&raw_array->raw[logical_cpu], data, &throwaway);
			return cpuid_set_error(ERR_OK);
		}
	}

	return cpuid_set_error(ERR_NOT_FOUND);
}